

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall t_st_generator::generate_service_client(t_st_generator *this,t_service *tservice)

{
  bool bVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  string signature;
  undefined1 local_168 [8];
  string funname;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_98;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_st_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"TClient",
             (allocator *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_98);
  ptVar2 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_(&local_b8,this,&ptVar2->super_t_type);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "Client");
    std::__cxx11::string::operator=(local_70,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar3 = std::operator<<((ostream *)&this->f_,local_70);
  poVar3 = std::operator<<(poVar3," subclass: #");
  client_class_name_abi_cxx11_(&local_118,this);
  prefix(&local_f8,this,&local_118);
  poVar3 = std::operator<<(poVar3,(string *)&local_f8);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"\tinstanceVariableNames: \'\'\n");
  poVar3 = std::operator<<(poVar3,"\tclassVariableNames: \'\'\n");
  poVar3 = std::operator<<(poVar3,"\tpoolDictionaries: \'\'\n");
  poVar3 = std::operator<<(poVar3,"\tcategory: \'");
  generated_category_abi_cxx11_(&local_138,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  std::operator<<(poVar3,"\'!\n\n");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  local_98._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  while( true ) {
    funname.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&funname.field_2 + 8));
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::string((string *)(signature.field_2._M_local_buf + 8),(string *)psVar5);
    t_generator::camelcase
              ((string *)local_168,(t_generator *)this,(string *)((long)&signature.field_2 + 8));
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    function_signature_abi_cxx11_((string *)local_1a8,this,*pptVar4);
    client_class_name_abi_cxx11_(&local_1c8,this);
    std::__cxx11::string::string((string *)&local_1e8,(string *)local_1a8);
    st_method(this,(ostream *)&this->f_,&local_1c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    function_types_comment_abi_cxx11_(&local_208,this,*pptVar4);
    poVar3 = std::operator<<((ostream *)&this->f_,(string *)&local_208);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_228);
    poVar3 = std::operator<<(poVar3,"self send");
    std::__cxx11::string::string((string *)&local_268,(string *)local_1a8);
    t_generator::capitalize(&local_248,(t_generator *)this,&local_268);
    poVar3 = std::operator<<(poVar3,(string *)&local_248);
    poVar3 = std::operator<<(poVar3,".");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    bVar1 = t_function::is_oneway(*pptVar4);
    if (!bVar1) {
      t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_,(string *)&local_288);
      poVar3 = std::operator<<(poVar3,"^ self recv");
      std::__cxx11::string::string((string *)&local_2c8,(string *)local_168);
      t_generator::capitalize(&local_2a8,(t_generator *)this,&local_2c8);
      poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
      poVar3 = std::operator<<(poVar3," success ");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_288);
    }
    st_close_method(this,(ostream *)&this->f_);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    generate_send_method(this,*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_98);
    bVar1 = t_function::is_oneway(*pptVar4);
    if (!bVar1) {
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_98);
      generate_recv_method(this,*pptVar4);
    }
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)local_168);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_98);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_st_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "TClient";
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = extends + "Client";
  }

  f_ << extends_client << " subclass: #" << prefix(client_class_name()) << endl
     << "\tinstanceVariableNames: ''\n"
     << "\tclassVariableNames: ''\n"
     << "\tpoolDictionaries: ''\n"
     << "\tcategory: '" << generated_category() << "'!\n\n";

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = camelcase((*f_iter)->get_name());
    string signature = function_signature(*f_iter);

    st_method(f_, client_class_name(), signature);
    f_ << function_types_comment(*f_iter) << endl << indent() << "self send"
       << capitalize(signature) << "." << endl;

    if (!(*f_iter)->is_oneway()) {
      f_ << indent() << "^ self recv" << capitalize(funname) << " success " << endl;
    }

    st_close_method(f_);

    generate_send_method(*f_iter);
    if (!(*f_iter)->is_oneway()) {
      generate_recv_method(*f_iter);
    }
  }
}